

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_resize_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::AV1ResizeXTest_DISABLED_SpeedTest_Test::
~AV1ResizeXTest_DISABLED_SpeedTest_Test(AV1ResizeXTest_DISABLED_SpeedTest_Test *this)

{
  AV1ResizeXTest_DISABLED_SpeedTest_Test *unaff_retaddr;
  
  anon_unknown.dwarf_122557b::AV1ResizeXTest_DISABLED_SpeedTest_Test::
  ~AV1ResizeXTest_DISABLED_SpeedTest_Test(unaff_retaddr);
  return;
}

Assistant:

TEST_P(AV1ResizeXTest, DISABLED_SpeedTest) { SpeedTest(); }